

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultUnfoundedCheck::isExternal(DefaultUnfoundedCheck *this,BodyPtr *n,weight_t *S)

{
  uint uVar1;
  pointer pAVar2;
  Solver *pSVar3;
  GraphPtr pDVar4;
  int iVar5;
  NodeId *x;
  uint *puVar6;
  ulong uVar7;
  
  puVar6 = (n->node->super_Node).sep_;
  iVar5 = *S;
  pAVar2 = (this->atoms_).ebo_.buf;
  pSVar3 = this->solver_;
  pDVar4 = this->graph_;
  if (((n->node->super_Node).field_0x7 & 0x20) == 0) {
    while ((uVar7 = (ulong)*puVar6, uVar7 != 0xffffffff && (-1 < iVar5))) {
      if (((pAVar2[uVar7].field_0x3 & 0x40) != 0) &&
         (uVar1 = (pDVar4->atoms_).ebo_.buf[uVar7].super_Node.lit.rep_,
         (byte)(*(byte *)((long)(pSVar3->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) &
               3) != (byte)(((uVar1 & 2) == 0) + 1U))) {
        iVar5 = iVar5 + -1;
        *S = iVar5;
      }
      puVar6 = puVar6 + 1;
    }
  }
  else {
    puVar6 = puVar6 + 1;
    while ((uVar7 = (ulong)puVar6[-1], uVar7 != 0xffffffff && (-1 < iVar5))) {
      if (((pAVar2[uVar7].field_0x3 & 0x40) != 0) &&
         (uVar1 = (pDVar4->atoms_).ebo_.buf[uVar7].super_Node.lit.rep_,
         (byte)(*(byte *)((long)(pSVar3->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) &
               3) != (byte)(((uVar1 & 2) == 0) + 1U))) {
        iVar5 = iVar5 - *puVar6;
        *S = iVar5;
      }
      puVar6 = puVar6 + 2;
    }
  }
  return -1 < iVar5;
}

Assistant:

bool DefaultUnfoundedCheck::isExternal(const BodyPtr& n, weight_t& S) const {
#define IN_UFS(id) ( (atoms_[(id)].ufs) && !solver_->isFalse(graph_->getAtom((id)).lit) )
	if (!n.node->sum()) {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; ++x) {
			if (IN_UFS(*x)) { S -= 1; }
		}
	}
	else {
		for (const NodeId* x = n.node->preds(); *x != idMax && S >= 0; x+=2) {
			if (IN_UFS(*x)) { S -= static_cast<weight_t>(x[1]); }
		}
	}
	return S >= 0;
#undef IN_UFS
}